

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ValueRelations.cpp
# Opt level: O0

Relations __thiscall dg::vr::ValueRelations::_between(ValueRelations *this,V lt,size_t rt)

{
  HandlePtr this_00;
  ValueRelations *in_RDI;
  HandlePtr mH;
  Handle in_stack_ffffffffffffffc8;
  bitset<12UL> local_8;
  
  this_00 = getBorderH(in_RDI,(size_t)in_stack_ffffffffffffffc8);
  if (this_00 == (HandlePtr)0x0) {
    memset(&local_8,0,8);
    Relations::Relations((Relations *)0x208eca);
  }
  else {
    local_8.super__Base_bitset<1UL>._M_w =
         (_Base_bitset<1UL>)_between((ValueRelations *)this_00,(V)in_RDI,in_stack_ffffffffffffffc8);
  }
  return (Relations)local_8.super__Base_bitset<1UL>._M_w._M_w;
}

Assistant:

Relations ValueRelations::_between(V lt, size_t rt) const {
    HandlePtr mH = getBorderH(rt);
    return mH ? _between(lt, *mH) : Relations();
}